

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O3

LogicalType * duckdb::GeoParquetFileMetadata::GeometryType(void)

{
  LogicalType *in_RDI;
  string local_38;
  
  LogicalType::LogicalType(in_RDI,BLOB);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"GEOMETRY","");
  LogicalType::SetAlias(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

LogicalType GeoParquetFileMetadata::GeometryType() {
	auto blob_type = LogicalType(LogicalTypeId::BLOB);
	blob_type.SetAlias("GEOMETRY");
	return blob_type;
}